

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_hdr_t * bam_hdr_read(BGZF *fp)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  bam_hdr_t *data;
  char *data_00;
  char **ppcVar4;
  uint32_t *puVar5;
  void *pvVar6;
  ulong uVar7;
  size_t __nmemb;
  long lVar8;
  int32_t name_len;
  char buf [4];
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar2 = bgzf_check_EOF(fp);
  if (iVar2 < 0) {
    perror("[W::sam_hdr_read] bgzf_check_EOF");
  }
  else if ((iVar2 == 0) && (1 < hts_verbose)) {
    bam_hdr_read_cold_1();
  }
  sVar3 = bgzf_read(fp,(void *)((long)&local_38 + 4),4);
  if (((int)sVar3 == 4) && (local_38._4_4_ == 0x14d4142)) {
    data = (bam_hdr_t *)calloc(1,0x38);
    puVar5 = &data->l_text;
    bgzf_read(fp,puVar5,4);
    if ((fp->field_0x2 & 0xc) != 0) {
      uVar1 = *puVar5;
      *puVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    uVar1 = data->l_text;
    data_00 = (char *)malloc((ulong)(uVar1 + 1));
    data->text = data_00;
    data_00[uVar1] = '\0';
    bgzf_read(fp,data_00,(ulong)uVar1);
    bgzf_read(fp,data,4);
    if ((fp->field_0x2 & 0xc) != 0) {
      uVar1 = data->n_targets;
      data->n_targets =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    iVar2 = data->n_targets;
    ppcVar4 = (char **)calloc((long)iVar2,8);
    data->target_name = ppcVar4;
    puVar5 = (uint32_t *)calloc((long)iVar2,4);
    data->target_len = puVar5;
    if (data->n_targets != 0) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        bgzf_read(fp,&local_38,4);
        if ((fp->field_0x2 & 0xc) != 0) {
          local_38 = CONCAT44(local_38._4_4_,
                              (uint)local_38 >> 0x18 | ((uint)local_38 & 0xff0000) >> 8 |
                              ((uint)local_38 & 0xff00) << 8 | (uint)local_38 << 0x18);
        }
        __nmemb = (size_t)(int)(uint)local_38;
        pvVar6 = calloc(__nmemb,1);
        *(void **)((long)data->target_name + lVar8 * 2) = pvVar6;
        bgzf_read(fp,*(void **)((long)data->target_name + lVar8 * 2),__nmemb);
        bgzf_read(fp,(void *)((long)data->target_len + lVar8),4);
        if ((fp->field_0x2 & 0xc) != 0) {
          uVar1 = *(uint *)((long)data->target_len + lVar8);
          *(uint *)((long)data->target_len + lVar8) =
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 4;
      } while (uVar7 != (uint)data->n_targets);
    }
  }
  else {
    if (0 < hts_verbose) {
      bam_hdr_read_cold_2();
    }
    data = (bam_hdr_t *)0x0;
  }
  return data;
}

Assistant:

bam_hdr_t *bam_hdr_read(BGZF *fp)
{
    bam_hdr_t *h;
    char buf[4];
    int magic_len, has_EOF;
    int32_t i = 1, name_len;
    // check EOF
    has_EOF = bgzf_check_EOF(fp);
    if (has_EOF < 0) {
        perror("[W::sam_hdr_read] bgzf_check_EOF");
    } else if (has_EOF == 0 && hts_verbose >= 2)
        fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
    // read "BAM1"
    magic_len = bgzf_read(fp, buf, 4);
    if (magic_len != 4 || strncmp(buf, "BAM\1", 4)) {
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] invalid BAM binary header\n", __func__);
        return 0;
    }
    h = bam_hdr_init();
    // read plain text and the number of reference sequences
    bgzf_read(fp, &h->l_text, 4);
    if (fp->is_be) ed_swap_4p(&h->l_text);
    h->text = (char*)malloc(h->l_text + 1);
    h->text[h->l_text] = 0; // make sure it is NULL terminated
    bgzf_read(fp, h->text, h->l_text);
    bgzf_read(fp, &h->n_targets, 4);
    if (fp->is_be) ed_swap_4p(&h->n_targets);
    // read reference sequence names and lengths
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    for (i = 0; i != h->n_targets; ++i) {
        bgzf_read(fp, &name_len, 4);
        if (fp->is_be) ed_swap_4p(&name_len);
        h->target_name[i] = (char*)calloc(name_len, 1);
        bgzf_read(fp, h->target_name[i], name_len);
        bgzf_read(fp, &h->target_len[i], 4);
        if (fp->is_be) ed_swap_4p(&h->target_len[i]);
    }
    return h;
}